

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int ns_socketpair2(sock_t *sp,int sock_type)

{
  int __fd;
  int iVar1;
  socklen_t len;
  socklen_t local_34;
  sockaddr local_30;
  
  local_34 = 0x10;
  sp[0] = -1;
  sp[1] = -1;
  local_30.sa_data[6] = '\0';
  local_30.sa_data[7] = '\0';
  local_30.sa_data[8] = '\0';
  local_30.sa_data[9] = '\0';
  local_30.sa_data[10] = '\0';
  local_30.sa_data[0xb] = '\0';
  local_30.sa_data[0xc] = '\0';
  local_30.sa_data[0xd] = '\0';
  local_30.sa_family = 2;
  local_30.sa_data[0] = '\0';
  local_30.sa_data[1] = '\0';
  local_30.sa_data[2] = '\x7f';
  local_30.sa_data[3] = '\0';
  local_30.sa_data[4] = '\0';
  local_30.sa_data[5] = '\x01';
  __fd = socket(2,sock_type,0);
  if (__fd == -1) {
LAB_00104c72:
    if (*sp != -1) {
      close(*sp);
    }
  }
  else {
    iVar1 = bind(__fd,&local_30,0x10);
    if (iVar1 != 0) goto LAB_00104c72;
    if (sock_type != 2) {
      iVar1 = listen(__fd,1);
      if (iVar1 != 0) goto LAB_00104c72;
    }
    iVar1 = getsockname(__fd,&local_30,&local_34);
    if (iVar1 != 0) goto LAB_00104c72;
    iVar1 = socket(2,sock_type,0);
    *sp = iVar1;
    if (iVar1 != -1) {
      iVar1 = connect(iVar1,&local_30,local_34);
      if (iVar1 == 0) {
        if (sock_type == 1) {
LAB_00104ce0:
          iVar1 = accept(__fd,&local_30,&local_34);
          sp[1] = iVar1;
          if (iVar1 != -1) {
LAB_00104cfe:
            iVar1 = 1;
            fcntl64(*sp,2,1);
            fcntl64(sp[1],2,1);
            goto LAB_00104c97;
          }
        }
        else {
          iVar1 = getsockname(*sp,&local_30,&local_34);
          if (iVar1 == 0) {
            iVar1 = connect(__fd,&local_30,local_34);
            if (iVar1 == 0) {
              if (sock_type != 2) goto LAB_00104ce0;
              sp[1] = __fd;
              goto LAB_00104cfe;
            }
          }
        }
      }
      goto LAB_00104c72;
    }
  }
  if (sp[1] != -1) {
    close(sp[1]);
  }
  sp[0] = -1;
  sp[1] = -1;
  iVar1 = 0;
LAB_00104c97:
  if (sock_type != 2) {
    close(__fd);
  }
  return iVar1;
}

Assistant:

int ns_socketpair2(sock_t sp[2], int sock_type) {
  union socket_address sa;
  sock_t sock;
  socklen_t len = sizeof(sa.sin);
  int ret = 0;

  sp[0] = sp[1] = INVALID_SOCKET;

  (void) memset(&sa, 0, sizeof(sa));
  sa.sin.sin_family = AF_INET;
  sa.sin.sin_port = htons(0);
  sa.sin.sin_addr.s_addr = htonl(0x7f000001);

  if ((sock = socket(AF_INET, sock_type, 0)) != INVALID_SOCKET &&
      !bind(sock, &sa.sa, len) &&
      (sock_type == SOCK_DGRAM || !listen(sock, 1)) &&
      !getsockname(sock, &sa.sa, &len) &&
      (sp[0] = socket(AF_INET, sock_type, 0)) != INVALID_SOCKET &&
      !connect(sp[0], &sa.sa, len) &&
      (sock_type == SOCK_STREAM ||
       (!getsockname(sp[0], &sa.sa, &len) && !connect(sock, &sa.sa, len))) &&
      (sp[1] = (sock_type == SOCK_DGRAM ? sock :
                accept(sock, &sa.sa, &len))) != INVALID_SOCKET) {
    ns_set_close_on_exec(sp[0]);
    ns_set_close_on_exec(sp[1]);
    ret = 1;
  } else {
    if (sp[0] != INVALID_SOCKET) closesocket(sp[0]);
    if (sp[1] != INVALID_SOCKET) closesocket(sp[1]);
    sp[0] = sp[1] = INVALID_SOCKET;
  }
  if (sock_type != SOCK_DGRAM) closesocket(sock);

  return ret;
}